

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O0

void swapInfoAdjacentVars(int iVar,char *pCanonPerm,uint *p_uCanonPhase)

{
  char cVar1;
  byte bVar2;
  char Temp;
  uint *p_uCanonPhase_local;
  char *pCanonPerm_local;
  int iVar_local;
  
  cVar1 = pCanonPerm[iVar];
  pCanonPerm[iVar] = pCanonPerm[iVar + 1];
  pCanonPerm[iVar + 1] = cVar1;
  bVar2 = (byte)iVar;
  if (((*p_uCanonPhase & 1 << (bVar2 & 0x1f)) != 0) !=
      ((*p_uCanonPhase & 1 << (bVar2 + 1 & 0x1f)) != 0)) {
    *p_uCanonPhase = 1 << (bVar2 & 0x1f) ^ *p_uCanonPhase;
    *p_uCanonPhase = 1 << (bVar2 + 1 & 0x1f) ^ *p_uCanonPhase;
  }
  return;
}

Assistant:

void swapInfoAdjacentVars(int iVar, char * pCanonPerm, unsigned* p_uCanonPhase)
{
    char Temp = pCanonPerm[iVar];
    pCanonPerm[iVar] = pCanonPerm[iVar+1];
    pCanonPerm[iVar+1] = Temp;
    
    // if the polarity of variables is different, swap them
    if ( ((*p_uCanonPhase & (1 << iVar)) > 0) != ((*p_uCanonPhase & (1 << (iVar+1))) > 0) )
    {
        *p_uCanonPhase ^= (1 << iVar);
        *p_uCanonPhase ^= (1 << (iVar+1));
    }
            
}